

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O0

void __thiscall SQInstance::Release(SQInstance *this)

{
  SQUnsignedInteger size_00;
  SQInteger size;
  SQInstance *this_local;
  
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef =
       (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef + 1;
  if (this->_hook != (SQRELEASEHOOK)0x0) {
    (*this->_hook)(this->_userpointer,0);
  }
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef =
       (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef - 1;
  if ((this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef == 0) {
    size_00 = this->_memsize;
    (**(this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted)();
    sq_vm_free(this,size_00);
  }
  return;
}

Assistant:

void Release() {
        _uiRef++;
        if (_hook) { _hook(_userpointer,0);}
        _uiRef--;
        if(_uiRef > 0) return;
        SQInteger size = _memsize;
        this->~SQInstance();
        SQ_FREE(this, size);
    }